

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O0

void __thiscall
nuraft::peer::peer(peer *this,ptr<srv_config> *config,context *ctx,executor *hb_exec,
                  ptr<logger> *logger)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  string *psVar4;
  element_type *peVar5;
  long in_RDI;
  undefined4 in_stack_fffffffffffffe78;
  __integral_type_conflict in_stack_fffffffffffffe7c;
  uint in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  bool fire_first_event;
  undefined4 uVar6;
  function<void_(int)> *in_stack_fffffffffffffe88;
  timer_helper *in_stack_fffffffffffffe90;
  context *in_stack_fffffffffffffe98;
  
  std::shared_ptr<nuraft::srv_config>::shared_ptr
            ((shared_ptr<nuraft::srv_config> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (shared_ptr<nuraft::srv_config> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::shared_ptr<nuraft::delayed_task_scheduler>::shared_ptr
            ((shared_ptr<nuraft::delayed_task_scheduler> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (shared_ptr<nuraft::delayed_task_scheduler> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  peVar2 = std::
           __shared_ptr_access<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nuraft::rpc_client_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15c981);
  peVar3 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15c996);
  psVar4 = srv_config::get_endpoint_abi_cxx11_(peVar3);
  (**(code **)(*(long *)peVar2 + 0x10))(in_RDI + 0x20,peVar2,psVar4);
  std::mutex::mutex((mutex *)0x15c9cd);
  context::get_params(in_stack_fffffffffffffe98);
  std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15ca0d);
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c);
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x15ca2a);
  context::get_params(in_stack_fffffffffffffe98);
  peVar5 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15ca6a);
  uVar6 = *(undefined4 *)(peVar5 + 8);
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x15ca81);
  *(undefined4 *)(in_RDI + 0x5c) = uVar6;
  context::get_params(in_stack_fffffffffffffe98);
  peVar5 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15cad2);
  uVar6 = *(undefined4 *)(peVar5 + 0xc);
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x15cae9);
  *(undefined4 *)(in_RDI + 0x60) = uVar6;
  context::get_params(in_stack_fffffffffffffe98);
  std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x15cb32);
  iVar1 = raft_params::max_hb_interval
                    ((raft_params *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x15cb50);
  *(int *)(in_RDI + 100) = iVar1;
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::atomic<long>::atomic
            ((atomic<long> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  *(undefined8 *)(in_RDI + 0x80) = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             SUB41((uint)in_stack_fffffffffffffe7c >> 0x18,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             SUB41((uint)in_stack_fffffffffffffe7c >> 0x18,0));
  *(undefined1 *)(in_RDI + 0x8a) = 0;
  peVar3 = std::__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15cc1a);
  srv_config::get_id(peVar3);
  cs_new<nuraft::timer_task<int>,std::function<void(int)>&,int,nuraft::timer_task_type>
            (in_stack_fffffffffffffe88,
             (int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (timer_task_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::shared_ptr<nuraft::delayed_task>::shared_ptr<nuraft::timer_task<int>,void>
            ((shared_ptr<nuraft::delayed_task> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (shared_ptr<nuraft::timer_task<int>_> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::shared_ptr<nuraft::timer_task<int>_>::~shared_ptr
            ((shared_ptr<nuraft::timer_task<int>_> *)0x15cc79);
  std::shared_ptr<nuraft::snapshot_sync_ctx>::shared_ptr
            ((shared_ptr<nuraft::snapshot_sync_ctx> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (nullptr_t)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::mutex::mutex((mutex *)0x15ccb3);
  *(undefined8 *)(in_RDI + 0xe8) = 0;
  *(undefined8 *)(in_RDI + 0xf0) = 0;
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = 0;
  *(undefined8 *)(in_RDI + 0xf8) = 0;
  std::mutex::mutex((mutex *)0x15cce6);
  timer_helper::timer_helper
            (in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
             SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0));
  timer_helper::timer_helper
            (in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
             SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0));
  timer_helper::timer_helper
            (in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
             SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0));
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c);
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c);
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             SUB41((uint)in_stack_fffffffffffffe7c >> 0x18,0));
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c);
  std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c);
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             SUB41((uint)in_stack_fffffffffffffe7c >> 0x18,0));
  std::atomic<int>::atomic
            ((atomic<int> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c);
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             SUB41((uint)in_stack_fffffffffffffe7c >> 0x18,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             SUB41((uint)in_stack_fffffffffffffe7c >> 0x18,0));
  fire_first_event = SUB41((uint)in_stack_fffffffffffffe84 >> 0x18,0);
  timer_helper::timer_helper
            (in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,fire_first_event);
  timer_helper::timer_helper
            (in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,fire_first_event);
  uVar6 = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)(ulong)in_stack_fffffffffffffe80,
             SUB41((uint)in_stack_fffffffffffffe7c >> 0x18,0));
  std::atomic<bool>::atomic
            ((atomic<bool> *)CONCAT44(uVar6,in_stack_fffffffffffffe80),
             SUB41((uint)in_stack_fffffffffffffe7c >> 0x18,0));
  std::shared_ptr<nuraft::req_msg>::shared_ptr
            ((shared_ptr<nuraft::req_msg> *)CONCAT44(uVar6,in_stack_fffffffffffffe80),
             (nullptr_t)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function((function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
            *)CONCAT44(uVar6,in_stack_fffffffffffffe80),
           (nullptr_t)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  std::shared_ptr<nuraft::logger>::shared_ptr
            ((shared_ptr<nuraft::logger> *)CONCAT44(uVar6,in_stack_fffffffffffffe80),
             (shared_ptr<nuraft::logger> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  reset_ls_timer((peer *)0x15cf0d);
  reset_resp_timer((peer *)0x15cf1c);
  reset_active_timer((peer *)0x15cf2b);
  return;
}

Assistant:

peer( ptr<srv_config>& config,
          const context& ctx,
          timer_task<int32>::executor& hb_exec,
          ptr<logger>& logger )
        : config_(config)
        , scheduler_(ctx.scheduler_)
        , rpc_( ctx.rpc_cli_factory_->create_client(config->get_endpoint()) )
        , current_hb_interval_( ctx.get_params()->heart_beat_interval_ )
        , hb_interval_( ctx.get_params()->heart_beat_interval_ )
        , rpc_backoff_( ctx.get_params()->rpc_failure_backoff_ )
        , max_hb_interval_( ctx.get_params()->max_hb_interval() )
        , next_log_idx_(0)
        , last_accepted_log_idx_(0)
        , next_batch_size_hint_in_bytes_(0)
        , matched_idx_(0)
        , busy_flag_(false)
        , pending_commit_flag_(false)
        , hb_enabled_(false)
        , hb_task_( cs_new< timer_task<int32>,
                            timer_task<int32>::executor&,
                            int32 >
                          ( hb_exec, config->get_id(),
                            timer_task_type::heartbeat_timer ) )
        , snp_sync_ctx_(nullptr)
        , lock_()
        , long_pause_warnings_(0)
        , network_recoveries_(0)
        , manual_free_(false)
        , rpc_errs_(0)
        , last_sent_idx_(0)
        , cnt_not_applied_(0)
        , leave_requested_(false)
        , hb_cnt_since_leave_(0)
        , stepping_down_(false)
        , reconn_scheduled_(false)
        , reconn_backoff_(0)
        , suppress_following_error_(false)
        , abandoned_(false)
        , rsv_msg_(nullptr)
        , rsv_msg_handler_(nullptr)
        , l_(logger)
    {
        reset_ls_timer();
        reset_resp_timer();
        reset_active_timer();
    }